

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa-verify.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  string ascFilename;
  string asc;
  string plain;
  string key;
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  vector<char,_std::allocator<char>_> cstr;
  ifstream ascFile;
  streambuf local_618 [504];
  ifstream textFile;
  streambuf local_410 [504];
  ifstream keyFile;
  streambuf local_208 [504];
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"VerifyRSA - https://github.com/rodlie/verifyrsa"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: rsa-verify <public key> <text file>");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar3 = 0;
  }
  else {
    key._M_dataplus._M_p = (pointer)&key.field_2;
    key._M_string_length = 0;
    plain._M_dataplus._M_p = (pointer)&plain.field_2;
    plain._M_string_length = 0;
    key.field_2._M_local_buf[0] = '\0';
    plain.field_2._M_local_buf[0] = '\0';
    asc._M_dataplus._M_p = (pointer)&asc.field_2;
    asc._M_string_length = 0;
    asc.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&keyFile);
    std::ifstream::ifstream(&textFile);
    std::ifstream::ifstream(&ascFile);
    std::ifstream::open((char *)&keyFile,(_Ios_Openmode)argv[1]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&cstr);
      std::ostream::operator<<
                ((ostream *)
                 &cstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_208);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&key,(string *)&ascFilename);
      std::__cxx11::string::~string((string *)&ascFilename);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&cstr);
    }
    std::ifstream::open((char *)&textFile,(_Ios_Openmode)argv[2]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&cstr);
      std::ostream::operator<<
                ((ostream *)
                 &cstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_410);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&plain,(string *)&ascFilename);
      std::__cxx11::string::~string((string *)&ascFilename);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&cstr);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ascFilename,argv[2],(allocator<char> *)&cstr);
    std::__cxx11::string::append((char *)&ascFilename);
    std::ifstream::open((char *)&ascFile,(_Ios_Openmode)ascFilename._M_dataplus._M_p);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&cstr);
      std::ostream::operator<<
                ((ostream *)
                 &cstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_618);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&asc,local_7d0);
      std::__cxx11::string::~string(local_7d0);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&cstr);
    }
    if (((key._M_string_length == 0) || (plain._M_string_length == 0)) ||
       (asc._M_string_length == 0)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Missing key, text or asc.");
      std::endl<char,std::char_traits<char>>(poVar2);
      uVar3 = 1;
    }
    else {
      std::vector<char,std::allocator<char>>::vector<char_const*,void>
                ((vector<char,std::allocator<char>> *)&cstr,asc._M_dataplus._M_p,
                 asc._M_dataplus._M_p + asc._M_string_length + 1,(allocator_type *)local_7d0);
      std::__cxx11::string::string(local_7f0,(string *)&key);
      std::__cxx11::string::string(local_810,(string *)&plain);
      cVar1 = VerifyRSA::verify(local_7f0,local_810,
                                cstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
      std::__cxx11::string::~string(local_810);
      std::__cxx11::string::~string(local_7f0);
      if (cVar1 == '\0') {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Bad signature!");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Valid signature!");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      uVar3 = (uint)(cVar1 == '\0');
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&cstr.super__Vector_base<char,_std::allocator<char>_>);
    }
    std::__cxx11::string::~string((string *)&ascFilename);
    std::ifstream::~ifstream(&ascFile);
    std::ifstream::~ifstream(&textFile);
    std::ifstream::~ifstream(&keyFile);
    std::__cxx11::string::~string((string *)&asc);
    std::__cxx11::string::~string((string *)&plain);
    std::__cxx11::string::~string((string *)&key);
  }
  return uVar3;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc<3) {
        std::cout << "VerifyRSA - https://github.com/rodlie/verifyrsa" << std::endl;
        std::cout << "" << std::endl;
        std::cout << "Usage: rsa-verify <public key> <text file>" << std::endl;
        return 0;
    }

    std::string key, plain, asc;
    std::ifstream keyFile, textFile, ascFile;
    keyFile.open(argv[1]);
    if (keyFile.is_open()) {
        std::stringstream ss;
        ss << keyFile.rdbuf();
        key = ss.str();
        keyFile.close();
    }
    textFile.open(argv[2]);
    if (textFile.is_open()) {
        std::stringstream ss;
        ss << textFile.rdbuf();
        plain = ss.str();
        textFile.close();
    }
    std::string ascFilename = argv[2];
    ascFilename.append(".asc");
    ascFile.open(ascFilename.c_str());
    if (ascFile.is_open()) {
        std::stringstream ss;
        ss << ascFile.rdbuf();
        asc = ss.str();
        ascFile.close();
    }

    if (key.empty() || plain.empty() || asc.empty()) {
        std::cerr << "Missing key, text or asc." << std::endl;
        return 1;
    }
    
    std::vector<char> cstr(asc.c_str(), asc.c_str() + asc.size() + 1);
    if (!VerifyRSA::verify(key, plain, cstr.data())) {
        std::cerr << "Bad signature!" << std::endl;
        return 1;
    }
    std::cout << "Valid signature!" << std::endl;
    return 0;
}